

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

bool __thiscall
cmCTestRunTest::EndTest(cmCTestRunTest *this,size_t completed,size_t total,bool started)

{
  unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *this_00;
  string *psVar1;
  ulong uVar2;
  pointer ppVar3;
  cmCTest *pcVar4;
  cmCTestTestHandler *this_01;
  bool bVar5;
  bool bVar6;
  State SVar7;
  Exception EVar8;
  int iVar9;
  ostream *poVar10;
  cmProcess *pcVar11;
  cmCTestTestProperties *pcVar12;
  undefined7 in_register_00000009;
  long lVar13;
  char *pcVar14;
  long lVar15;
  char *pcVar16;
  bool bVar17;
  pointer ppVar18;
  double dVar19;
  byte local_7d0;
  string output;
  string testName;
  string reason;
  char *local_748 [4];
  ostringstream cmCTestLog_msg_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_718 [22];
  ostringstream outputStream;
  pointer local_5a8 [46];
  char buf [1024];
  
  WriteLogOutputTop(this,completed,total);
  reason._M_dataplus._M_p = (pointer)&reason.field_2;
  reason._M_string_length = 0;
  reason.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000009,started) == 0) {
    SVar7 = Error;
LAB_004848d3:
    this->TimeoutIsForStopTime = false;
  }
  else {
    SVar7 = cmProcess::GetProcessStatus
                      ((this->TestProcess)._M_t.
                       super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
                       super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                       super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl);
    if (SVar7 != Expired) goto LAB_004848d3;
    SVar7 = Expired;
  }
  uVar2 = ((this->TestProcess)._M_t.
           super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
           super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
           super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl)->ExitValue;
  ppVar18 = (this->TestProperties->RequiredRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->TestProperties->RequiredRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = false;
  if ((ppVar18 != ppVar3) &&
     ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    for (; ppVar18 != ppVar3; ppVar18 = ppVar18 + 1) {
      bVar5 = cmsys::RegularExpression::find(&ppVar18->first,&this->ProcessOutput);
      if (bVar5) {
        buf[0] = '*';
        buf[1] = '\0';
        buf[2] = '\0';
        buf[3] = '\0';
        buf[4] = '\0';
        buf[5] = '\0';
        buf[6] = '\0';
        buf[7] = '\0';
        buf._8_8_ = anon_var_dwarf_1abdba2;
        local_5a8[0] = (ppVar18->second)._M_dataplus._M_p;
        _outputStream = (ppVar18->second)._M_string_length;
        output._M_dataplus._M_p._0_1_ = 0x5d;
        cmStrCat<char>((string *)&cmCTestLog_msg_1,(cmAlphaNum *)buf,(cmAlphaNum *)&outputStream,
                       (char *)&output);
        std::__cxx11::string::operator=((string *)&reason,(string *)&cmCTestLog_msg_1);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
        bVar5 = false;
        goto LAB_00484a0b;
      }
    }
    std::__cxx11::string::assign((char *)&reason);
    ppVar3 = (this->TestProperties->RequiredRegularExpressions).
             super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar18 = (this->TestProperties->RequiredRegularExpressions).
                   super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar18 != ppVar3;
        ppVar18 = ppVar18 + 1) {
      std::__cxx11::string::append((string *)&reason);
      std::__cxx11::string::append((char *)&reason);
    }
    bVar5 = true;
    std::__cxx11::string::append((char *)&reason);
  }
LAB_00484a0b:
  ppVar18 = (this->TestProperties->ErrorRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->TestProperties->ErrorRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((ppVar18 != ppVar3) &&
     ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    for (; ppVar18 != ppVar3; ppVar18 = ppVar18 + 1) {
      bVar6 = cmsys::RegularExpression::find(&ppVar18->first,&this->ProcessOutput);
      if (bVar6) {
        buf[0] = '1';
        buf[1] = '\0';
        buf[2] = '\0';
        buf[3] = '\0';
        buf[4] = '\0';
        buf[5] = '\0';
        buf[6] = '\0';
        buf[7] = '\0';
        buf._8_8_ = anon_var_dwarf_1abdbd8;
        local_5a8[0] = (ppVar18->second)._M_dataplus._M_p;
        _outputStream = (ppVar18->second)._M_string_length;
        output._M_dataplus._M_p._0_1_ = 0x5d;
        cmStrCat<char>((string *)&cmCTestLog_msg_1,(cmAlphaNum *)buf,(cmAlphaNum *)&outputStream,
                       (char *)&output);
        std::__cxx11::string::operator=((string *)&reason,(string *)&cmCTestLog_msg_1);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
        bVar5 = true;
        break;
      }
    }
  }
  ppVar18 = (this->TestProperties->SkipRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->TestProperties->SkipRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = false;
  if ((ppVar18 != ppVar3) &&
     (bVar6 = false,
     (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    for (; ppVar18 != ppVar3; ppVar18 = ppVar18 + 1) {
      bVar6 = cmsys::RegularExpression::find(&ppVar18->first,&this->ProcessOutput);
      if (bVar6) {
        buf[0] = '0';
        buf[1] = '\0';
        buf[2] = '\0';
        buf[3] = '\0';
        buf[4] = '\0';
        buf[5] = '\0';
        buf[6] = '\0';
        buf[7] = '\0';
        buf._8_8_ = anon_var_dwarf_1abdbee;
        local_5a8[0] = (ppVar18->second)._M_dataplus._M_p;
        _outputStream = (ppVar18->second)._M_string_length;
        output._M_dataplus._M_p._0_1_ = 0x5d;
        cmStrCat<char>((string *)&cmCTestLog_msg_1,(cmAlphaNum *)buf,(cmAlphaNum *)&outputStream,
                       (char *)&output);
        std::__cxx11::string::operator=((string *)&reason,(string *)&cmCTestLog_msg_1);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
        bVar6 = true;
        goto LAB_00484b81;
      }
    }
    bVar6 = false;
  }
LAB_00484b81:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&outputStream);
  this_00 = &this->TestProcess;
  if (SVar7 == Exception) {
    bVar5 = cmCTest::GetOutputTestOutputOnTestFailure(this->CTest);
    std::operator<<((ostream *)&outputStream,"***Exception: ");
    cmProcess::GetExitExceptionString_abi_cxx11_
              ((string *)buf,
               (this_00->_M_t).super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>.
               _M_t.super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
               super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl);
    psVar1 = &(this->TestResult).ExceptionStatus;
    std::__cxx11::string::operator=((string *)psVar1,(string *)buf);
    std::__cxx11::string::~string((string *)buf);
    EVar8 = cmProcess::GetExitException
                      ((this->TestProcess)._M_t.
                       super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
                       super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                       super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl);
    switch(EVar8) {
    case Fault:
      std::operator<<((ostream *)&outputStream,"SegFault");
      (this->TestResult).Status = 2;
      break;
    case Illegal:
      std::operator<<((ostream *)&outputStream,"Illegal");
      (this->TestResult).Status = 3;
      break;
    case Interrupt:
      std::operator<<((ostream *)&outputStream,"Interrupt");
      (this->TestResult).Status = 4;
      break;
    case Numerical:
      std::operator<<((ostream *)&outputStream,"Numerical");
      (this->TestResult).Status = 5;
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
      std::operator<<((ostream *)buf,(string *)psVar1);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xd8,_cmCTestLog_msg_1,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
      (this->TestResult).Status = 6;
    }
  }
  else if (SVar7 == Expired) {
    std::operator<<((ostream *)&outputStream,"***Timeout ");
    (this->TestResult).Status = 1;
    bVar5 = cmCTest::GetOutputTestOutputOnTestFailure(this->CTest);
  }
  else {
    if (SVar7 == Exited) {
      if (bVar5) {
        pcVar12 = this->TestProperties;
        bVar5 = false;
      }
      else {
        pcVar12 = this->TestProperties;
        if (uVar2 == 0) {
          bVar5 = true;
        }
        else {
          bVar5 = (pcVar12->RequiredRegularExpressions).
                  super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pcVar12->RequiredRegularExpressions).
                  super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      if ((bool)((uVar2 == (uint)pcVar12->SkipReturnCode && -1 < pcVar12->SkipReturnCode) | bVar6))
      {
        (this->TestResult).Status = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
        if (bVar6) {
          std::operator<<((ostream *)buf,"SKIP_REGULAR_EXPRESSION_MATCHED");
        }
        else {
          poVar10 = std::operator<<((ostream *)buf,"SKIP_RETURN_CODE=");
          std::ostream::operator<<(poVar10,this->TestProperties->SkipReturnCode);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)&(this->TestResult).CompletionStatus,(string *)&cmCTestLog_msg_1);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
        std::operator<<((ostream *)&outputStream,"***Skipped ");
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
        local_7d0 = 1;
        bVar5 = false;
        goto LAB_00484ccb;
      }
      if (bVar5 == pcVar12->WillFail) {
        (this->TestResult).Status = 7;
        poVar10 = std::operator<<((ostream *)&outputStream,"***Failed  ");
        std::operator<<(poVar10,(string *)&reason);
        bVar5 = cmCTest::GetOutputTestOutputOnTestFailure(this->CTest);
        goto LAB_00484cc3;
      }
      (this->TestResult).Status = 9;
      std::operator<<((ostream *)&outputStream,"   Passed  ");
    }
    else {
      bVar5 = std::operator==("Disabled",&(this->TestResult).CompletionStatus);
      pcVar14 = "***Not Run ";
      if (bVar5) {
        pcVar14 = "***Not Run (Disabled) ";
      }
      std::operator<<((ostream *)&outputStream,pcVar14);
    }
    bVar5 = false;
  }
LAB_00484cc3:
  local_7d0 = 0;
LAB_00484ccb:
  iVar9 = (this->TestResult).Status;
  snprintf(buf,0x400,"%6.2f sec",
           (((this->TestProcess)._M_t.
             super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
             super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
             super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl)->TotalTime).__r);
  poVar10 = std::operator<<((ostream *)&outputStream,buf);
  std::operator<<(poVar10,"\n");
  bVar6 = cmCTest::GetTestProgressOutput(this->CTest);
  bVar17 = (bool)(iVar9 == 9 | local_7d0);
  if (bVar6) {
    if (bVar17 == false) {
      GetTestPrefix_abi_cxx11_(&output,this,completed,total);
      std::__cxx11::string::string((string *)&testName,(string *)this->TestProperties);
      iVar9 = cmCTest::GetMaxTestNameWidth(this->CTest);
      std::__cxx11::string::resize((ulong)&testName,(char)iVar9 + '\x04');
      std::__cxx11::string::append((string *)&output);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)&output);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCTestLog_msg_1,"",(allocator<char> *)local_748);
      std::__cxx11::stringbuf::str((string *)local_5a8);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
      std::ios::clear((int)&outputStream + (int)*(undefined8 *)(_outputStream - 0x18));
      std::operator<<((ostream *)&outputStream,(string *)&output);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
      std::operator<<((ostream *)&cmCTestLog_msg_1,"\n");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf6,local_748[0],false);
      std::__cxx11::string::~string((string *)local_748);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
      std::__cxx11::string::~string((string *)&testName);
      std::__cxx11::string::~string((string *)&output);
    }
    if (completed == total) {
      GetTestPrefix_abi_cxx11_(&testName,this,completed,completed);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg_1,&testName,&this->TestProperties->Name);
      std::operator+(&output,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &cmCTestLog_msg_1,"\n");
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
      std::__cxx11::string::~string((string *)&testName);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
      std::operator<<((ostream *)&cmCTestLog_msg_1,(string *)&output);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xfb,testName._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&testName);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
      std::__cxx11::string::~string((string *)&output);
    }
  }
  bVar6 = cmCTest::GetTestProgressOutput(this->CTest);
  if ((bVar6 & bVar17) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&cmCTestLog_msg_1,(string *)&output);
    std::__cxx11::string::~string((string *)&output);
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xff,(char *)CONCAT71(output._M_dataplus._M_p._1_7_,output._M_dataplus._M_p._0_1_)
                 ,false);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
  }
  if (bVar5 != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
    poVar10 = std::operator<<((ostream *)&cmCTestLog_msg_1,(string *)&this->ProcessOutput);
    std::endl<char,std::char_traits<char>>(poVar10);
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x103,(char *)CONCAT71(output._M_dataplus._M_p._1_7_,output._M_dataplus._M_p._0_1_
                                        ),false);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
  }
  poVar10 = this->TestHandler->LogFile;
  if (poVar10 != (ostream *)0x0) {
    poVar10 = std::operator<<(poVar10,"Test time = ");
    poVar10 = std::operator<<(poVar10,buf);
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  ParseOutputForMeasurements(this);
  if ((started) && (this_01 = this->TestHandler, this_01->MemCheck == false)) {
    cmCTestTestHandler::CleanTestOutput
              (this_01,&this->ProcessOutput,
               (long)(&this_01->CustomMaximumPassedTestOutputSize)[(this->TestResult).Status != 9],
               this_01->TestOutputTruncation);
  }
  psVar1 = &(this->TestResult).Reason;
  std::__cxx11::string::_M_assign((string *)psVar1);
  if (this->TestHandler->LogFile != (ostream *)0x0) {
    iVar9 = (this->TestResult).Status;
    pcVar16 = "Test Pass Reason";
    pcVar14 = "Test Passed.\n";
    if ((iVar9 != 0) && (iVar9 != 9)) {
      pcVar16 = "Test Fail Reason";
      pcVar14 = "Test Failed.\n";
    }
    dVar19 = (((this->TestProcess)._M_t.
               super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
               super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
               super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl)->TotalTime).__r;
    lVar13 = (long)(dVar19 / 3600.0);
    dVar19 = dVar19 - (double)lVar13 * 3600.0;
    lVar15 = (long)(dVar19 / 60.0);
    snprintf((char *)&cmCTestLog_msg_1,100,"%02d:%02d:%02d",lVar13,lVar15,
             (long)(dVar19 - (double)lVar15 * 60.0));
    poVar10 = std::operator<<(this->TestHandler->LogFile,
                              "----------------------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar10);
    poVar10 = this->TestHandler->LogFile;
    if ((this->TestResult).Reason._M_string_length != 0) {
      poVar10 = std::operator<<(poVar10,pcVar16);
      poVar10 = std::operator<<(poVar10,":\n");
      poVar10 = std::operator<<(poVar10,(string *)psVar1);
      pcVar14 = "\n";
    }
    std::operator<<(poVar10,pcVar14);
    poVar10 = std::operator<<(this->TestHandler->LogFile,"\"");
    poVar10 = std::operator<<(poVar10,(string *)this->TestProperties);
    poVar10 = std::operator<<(poVar10,"\" end time: ");
    cmCTest::CurrentTime_abi_cxx11_(&output,this->CTest);
    poVar10 = std::operator<<(poVar10,(string *)&output);
    poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
    poVar10 = std::operator<<(poVar10,"\"");
    poVar10 = std::operator<<(poVar10,(string *)this->TestProperties);
    poVar10 = std::operator<<(poVar10,"\" time elapsed: ");
    poVar10 = std::operator<<(poVar10,(char *)&cmCTestLog_msg_1);
    poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
    poVar10 = std::operator<<(poVar10,"----------------------------------------------------------");
    poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
    std::endl<char,std::char_traits<char>>(poVar10);
    std::__cxx11::string::~string((string *)&output);
  }
  if (started) {
    _cmCTestLog_msg_1 = (pointer)local_718;
    local_718[0]._M_local_buf[0] = '\0';
    if ((this->TestHandler->MemCheck == false) &&
       (bVar5 = cmCTest::ShouldCompressTestOutput(this->CTest), bVar5)) {
      std::__cxx11::string::string((string *)&output,(string *)&this->ProcessOutput);
      bVar5 = cmCTest::CompressString(this->CTest,&output);
      if (bVar5) {
        std::__cxx11::string::operator=((string *)&cmCTestLog_msg_1,(string *)&output);
      }
      std::__cxx11::string::~string((string *)&output);
    }
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    (this->TestResult).CompressOutput = false;
    pcVar11 = (this->TestProcess)._M_t.
              super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
              super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
              super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl;
    (this->TestResult).ReturnValue = pcVar11->ExitValue;
    if (local_7d0 == 0) {
      std::__cxx11::string::assign((char *)&(this->TestResult).CompletionStatus);
      pcVar11 = (this_00->_M_t).super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>.
                _M_t.super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl;
    }
    (this->TestResult).ExecutionTime.__r = (pcVar11->TotalTime).__r;
    MemCheckPostProcess(this);
    ComputeWeightedCost(this);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  }
  bVar5 = NeedsToRepeat(this);
  if (!bVar5) {
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::push_back(&this->TestHandler->TestResults,&this->TestResult);
  }
  std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
            ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)this_00,(pointer)0x0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&outputStream);
  std::__cxx11::string::~string((string *)&reason);
  return bVar17;
}

Assistant:

bool cmCTestRunTest::EndTest(size_t completed, size_t total, bool started)
{
  this->WriteLogOutputTop(completed, total);
  std::string reason;
  bool passed = true;
  cmProcess::State res =
    started ? this->TestProcess->GetProcessStatus() : cmProcess::State::Error;
  if (res != cmProcess::State::Expired) {
    this->TimeoutIsForStopTime = false;
  }
  std::int64_t retVal = this->TestProcess->GetExitValue();
  bool forceFail = false;
  bool forceSkip = false;
  bool skipped = false;
  bool outputTestErrorsToConsole = false;
  if (!this->TestProperties->RequiredRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    bool found = false;
    for (auto& pass : this->TestProperties->RequiredRegularExpressions) {
      if (pass.first.find(this->ProcessOutput)) {
        found = true;
        reason = cmStrCat("Required regular expression found. Regex=[",
                          pass.second, ']');
        break;
      }
    }
    if (!found) {
      reason = "Required regular expression not found. Regex=[";
      for (auto& pass : this->TestProperties->RequiredRegularExpressions) {
        reason += pass.second;
        reason += "\n";
      }
      reason += "]";
      forceFail = true;
    }
  }
  if (!this->TestProperties->ErrorRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    for (auto& fail : this->TestProperties->ErrorRegularExpressions) {
      if (fail.first.find(this->ProcessOutput)) {
        reason = cmStrCat("Error regular expression found in output. Regex=[",
                          fail.second, ']');
        forceFail = true;
        break;
      }
    }
  }
  if (!this->TestProperties->SkipRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    for (auto& skip : this->TestProperties->SkipRegularExpressions) {
      if (skip.first.find(this->ProcessOutput)) {
        reason = cmStrCat("Skip regular expression found in output. Regex=[",
                          skip.second, ']');
        forceSkip = true;
        break;
      }
    }
  }
  std::ostringstream outputStream;
  if (res == cmProcess::State::Exited) {
    bool success = !forceFail &&
      (retVal == 0 ||
       !this->TestProperties->RequiredRegularExpressions.empty());
    if ((this->TestProperties->SkipReturnCode >= 0 &&
         this->TestProperties->SkipReturnCode == retVal) ||
        forceSkip) {
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      std::ostringstream s;
      if (forceSkip) {
        s << "SKIP_REGULAR_EXPRESSION_MATCHED";
      } else {
        s << "SKIP_RETURN_CODE=" << this->TestProperties->SkipReturnCode;
      }
      this->TestResult.CompletionStatus = s.str();
      outputStream << "***Skipped ";
      skipped = true;
    } else if (success != this->TestProperties->WillFail) {
      this->TestResult.Status = cmCTestTestHandler::COMPLETED;
      outputStream << "   Passed  ";
    } else {
      this->TestResult.Status = cmCTestTestHandler::FAILED;
      outputStream << "***Failed  " << reason;
      outputTestErrorsToConsole =
        this->CTest->GetOutputTestOutputOnTestFailure();
    }
  } else if (res == cmProcess::State::Expired) {
    outputStream << "***Timeout ";
    this->TestResult.Status = cmCTestTestHandler::TIMEOUT;
    outputTestErrorsToConsole =
      this->CTest->GetOutputTestOutputOnTestFailure();
  } else if (res == cmProcess::State::Exception) {
    outputTestErrorsToConsole =
      this->CTest->GetOutputTestOutputOnTestFailure();
    outputStream << "***Exception: ";
    this->TestResult.ExceptionStatus =
      this->TestProcess->GetExitExceptionString();
    switch (this->TestProcess->GetExitException()) {
      case cmProcess::Exception::Fault:
        outputStream << "SegFault";
        this->TestResult.Status = cmCTestTestHandler::SEGFAULT;
        break;
      case cmProcess::Exception::Illegal:
        outputStream << "Illegal";
        this->TestResult.Status = cmCTestTestHandler::ILLEGAL;
        break;
      case cmProcess::Exception::Interrupt:
        outputStream << "Interrupt";
        this->TestResult.Status = cmCTestTestHandler::INTERRUPT;
        break;
      case cmProcess::Exception::Numerical:
        outputStream << "Numerical";
        this->TestResult.Status = cmCTestTestHandler::NUMERICAL;
        break;
      default:
        cmCTestLog(this->CTest, HANDLER_OUTPUT,
                   this->TestResult.ExceptionStatus);
        this->TestResult.Status = cmCTestTestHandler::OTHER_FAULT;
    }
  } else if ("Disabled" == this->TestResult.CompletionStatus) {
    outputStream << "***Not Run (Disabled) ";
  } else // cmProcess::State::Error
  {
    outputStream << "***Not Run ";
  }

  passed = this->TestResult.Status == cmCTestTestHandler::COMPLETED;
  char buf[1024];
  snprintf(buf, sizeof(buf), "%6.2f sec",
           this->TestProcess->GetTotalTime().count());
  outputStream << buf << "\n";

  bool passedOrSkipped = passed || skipped;
  if (this->CTest->GetTestProgressOutput()) {
    if (!passedOrSkipped) {
      // If the test did not pass, reprint test name and error
      std::string output = this->GetTestPrefix(completed, total);
      std::string testName = this->TestProperties->Name;
      const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
      testName.resize(maxTestNameWidth + 4, '.');

      output += testName;
      output += outputStream.str();
      outputStream.str("");
      outputStream.clear();
      outputStream << output;
      cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, "\n"); // flush
    }
    if (completed == total) {
      std::string testName = this->GetTestPrefix(completed, total) +
        this->TestProperties->Name + "\n";
      cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, testName);
    }
  }
  if (!this->CTest->GetTestProgressOutput() || !passedOrSkipped) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, outputStream.str());
  }

  if (outputTestErrorsToConsole) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, this->ProcessOutput << std::endl);
  }

  if (this->TestHandler->LogFile) {
    *this->TestHandler->LogFile << "Test time = " << buf << std::endl;
  }

  this->ParseOutputForMeasurements();

  // if this is doing MemCheck then all the output needs to be put into
  // Output since that is what is parsed by cmCTestMemCheckHandler
  if (!this->TestHandler->MemCheck && started) {
    this->TestHandler->CleanTestOutput(
      this->ProcessOutput,
      static_cast<size_t>(
        this->TestResult.Status == cmCTestTestHandler::COMPLETED
          ? this->TestHandler->CustomMaximumPassedTestOutputSize
          : this->TestHandler->CustomMaximumFailedTestOutputSize),
      this->TestHandler->TestOutputTruncation);
  }
  this->TestResult.Reason = reason;
  if (this->TestHandler->LogFile) {
    bool pass = true;
    const char* reasonType = "Test Pass Reason";
    if (this->TestResult.Status != cmCTestTestHandler::COMPLETED &&
        this->TestResult.Status != cmCTestTestHandler::NOT_RUN) {
      reasonType = "Test Fail Reason";
      pass = false;
    }
    auto ttime = this->TestProcess->GetTotalTime();
    auto hours = std::chrono::duration_cast<std::chrono::hours>(ttime);
    ttime -= hours;
    auto minutes = std::chrono::duration_cast<std::chrono::minutes>(ttime);
    ttime -= minutes;
    auto seconds = std::chrono::duration_cast<std::chrono::seconds>(ttime);
    char buffer[100];
    snprintf(buffer, sizeof(buffer), "%02d:%02d:%02d",
             static_cast<unsigned>(hours.count()),
             static_cast<unsigned>(minutes.count()),
             static_cast<unsigned>(seconds.count()));
    *this->TestHandler->LogFile
      << "----------------------------------------------------------"
      << std::endl;
    if (!this->TestResult.Reason.empty()) {
      *this->TestHandler->LogFile << reasonType << ":\n"
                                  << this->TestResult.Reason << "\n";
    } else {
      if (pass) {
        *this->TestHandler->LogFile << "Test Passed.\n";
      } else {
        *this->TestHandler->LogFile << "Test Failed.\n";
      }
    }
    *this->TestHandler->LogFile
      << "\"" << this->TestProperties->Name
      << "\" end time: " << this->CTest->CurrentTime() << std::endl
      << "\"" << this->TestProperties->Name << "\" time elapsed: " << buffer
      << std::endl
      << "----------------------------------------------------------"
      << std::endl
      << std::endl;
  }
  // if the test actually started and ran
  // record the results in TestResult
  if (started) {
    std::string compressedOutput;
    if (!this->TestHandler->MemCheck &&
        this->CTest->ShouldCompressTestOutput()) {
      std::string str = this->ProcessOutput;
      if (this->CTest->CompressString(str)) {
        compressedOutput = std::move(str);
      }
    }
    bool compress = !compressedOutput.empty() &&
      compressedOutput.length() < this->ProcessOutput.length();
    this->TestResult.Output =
      compress ? compressedOutput : this->ProcessOutput;
    this->TestResult.CompressOutput = compress;
    this->TestResult.ReturnValue = this->TestProcess->GetExitValue();
    if (!skipped) {
      this->TestResult.CompletionStatus = "Completed";
    }
    this->TestResult.ExecutionTime = this->TestProcess->GetTotalTime();
    this->MemCheckPostProcess();
    this->ComputeWeightedCost();
  }
  // If the test does not need to rerun push the current TestResult onto the
  // TestHandler vector
  if (!this->NeedsToRepeat()) {
    this->TestHandler->TestResults.push_back(this->TestResult);
  }
  this->TestProcess.reset();
  return passed || skipped;
}